

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_extension.cc
# Opt level: O0

void __thiscall
MallocExtension::GetHeapGrowthStacks(MallocExtension *this,MallocExtensionWriter *writer)

{
  int iVar1;
  undefined4 extraout_var;
  uintptr_t uVar2;
  void **local_30;
  void **entry;
  char *kErrorMsg;
  void **entries;
  MallocExtensionWriter *writer_local;
  MallocExtension *this_local;
  void **entries_00;
  
  iVar1 = (*this->_vptr_MallocExtension[0x1a])();
  entries_00 = (void **)CONCAT44(extraout_var,iVar1);
  if (entries_00 == (void **)0x0) {
    std::__cxx11::string::append((char *)writer,0x15ca5f);
  }
  else {
    anon_unknown.dwarf_40e97::PrintHeader(writer,"growth",entries_00);
    local_30 = entries_00;
    while( true ) {
      uVar2 = anon_unknown.dwarf_40e97::Count(local_30);
      if (uVar2 == 0) break;
      anon_unknown.dwarf_40e97::PrintStackEntry(writer,local_30);
      uVar2 = anon_unknown.dwarf_40e97::Depth(local_30);
      local_30 = local_30 + uVar2 + 3;
    }
    if (entries_00 != (void **)0x0) {
      operator_delete__(entries_00);
    }
    DumpAddressMap(writer);
  }
  return;
}

Assistant:

void MallocExtension::GetHeapGrowthStacks(MallocExtensionWriter* writer) {
  void** entries = ReadHeapGrowthStackTraces();
  if (entries == nullptr) {
    const char* const kErrorMsg =
        "This malloc implementation does not support "
        "ReadHeapGrowthStackTraces().\n"
        "As of 2005/09/27, only tcmalloc supports this, and you\n"
        "are probably running a binary that does not use tcmalloc.\n";
    writer->append(kErrorMsg, strlen(kErrorMsg));
    return;
  }

  // Do not canonicalize the stack entries, so that we get a
  // time-ordered list of stack traces, which may be useful if the
  // client wants to focus on the latest stack traces.
  PrintHeader(writer, "growth", entries);
  for (void** entry = entries; Count(entry) != 0; entry += 3 + Depth(entry)) {
    PrintStackEntry(writer, entry);
  }
  delete[] entries;

  DumpAddressMap(writer);
}